

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O3

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetGame(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar3;
  iterator iVar4;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Ptr PVar10;
  Ptr PVar11;
  path_type local_a0;
  ptree *local_70;
  type local_68;
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  local_48;
  
  local_70 = data;
  puVar3 = (undefined8 *)operator_new(0xb0);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_002a54f0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[0xc] = 0;
  puVar3[0xd] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[0xe] = 0;
  puVar3[0xf] = 0;
  puVar3[0x10] = 0;
  puVar3[2] = puVar3 + 4;
  puVar3[3] = 0;
  puVar3[6] = puVar3 + 8;
  puVar3[10] = 0;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  puVar3[0xd] = puVar3 + 0xf;
  puVar3[0x11] = 0;
  puVar3[0x12] = 0;
  puVar3[0x13] = 0;
  puVar3[0x14] = 0;
  puVar3[0x15] = 0;
  *(undefined8 **)(this + 8) = puVar3;
  *(string **)this = (string *)(puVar3 + 2);
  paVar1 = &local_a0.m_value.field_2;
  local_a0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"title","");
  local_a0.m_separator = '.';
  local_a0.m_start._M_current = local_a0.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_68,in_RDX,&local_a0,"");
  std::__cxx11::string::operator=((string *)(puVar3 + 2),(string *)&local_68);
  paVar2 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_value._M_dataplus._M_p);
  }
  local_a0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"description","");
  local_a0.m_separator = '.';
  local_a0.m_start._M_current = local_a0.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_68,in_RDX,&local_a0,"");
  std::__cxx11::string::operator=((string *)(puVar3 + 6),(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_value._M_dataplus._M_p);
  }
  local_a0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"photo","");
  parseJsonAndGetArray<TgBot::PhotoSize>
            ((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
              *)&local_48,(TgTypeParser *)local_70,0x1b584c,(ptree *)0x0,&in_RDX->m_data);
  local_68.field_2._M_allocated_capacity = puVar3[0xc];
  puVar3[0xc] = local_48.
                super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68._M_dataplus._M_p = (pointer)puVar3[10];
  local_68._M_string_length = puVar3[0xb];
  puVar3[10] = local_48.
               super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  puVar3[0xb] = local_48.
                super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  ~vector((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
           *)&local_68);
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  ~vector((vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
           *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_value._M_dataplus._M_p);
  }
  local_a0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"text","");
  local_a0.m_separator = '.';
  local_a0.m_start._M_current = local_a0.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_68,in_RDX,&local_a0,"");
  std::__cxx11::string::operator=((string *)(puVar3 + 0xd),(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_value._M_dataplus._M_p);
  }
  local_a0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"text_entities","");
  parseJsonAndGetArray<TgBot::MessageEntity>
            (&local_48,(TgTypeParser *)local_70,0x1b427c,(ptree *)0x0,&in_RDX->m_data);
  local_68.field_2._M_allocated_capacity = puVar3[0x13];
  puVar3[0x13] = local_48.
                 super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68._M_dataplus._M_p = (pointer)puVar3[0x11];
  local_68._M_string_length = puVar3[0x12];
  puVar3[0x11] = local_48.
                 super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  puVar3[0x12] = local_48.
                 super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::~vector((vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
             *)&local_68);
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_value._M_dataplus._M_p);
  }
  local_a0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"animation","");
  iVar4 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&local_a0.m_value);
  if (iVar4.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    uVar6 = 0;
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    _Var5._M_pi = extraout_RDX;
  }
  else {
    PVar10 = parseJsonAndGetAnimation((TgTypeParser *)&local_68,local_70);
    _Var5 = PVar10.super___shared_ptr<TgBot::Animation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    uVar6 = local_68._M_dataplus._M_p._0_4_;
    uVar7 = local_68._M_dataplus._M_p._4_4_;
    uVar8 = (undefined4)local_68._M_string_length;
    uVar9 = local_68._M_string_length._4_4_;
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3[0x15];
  *(undefined4 *)(puVar3 + 0x14) = uVar6;
  *(undefined4 *)((long)puVar3 + 0xa4) = uVar7;
  *(undefined4 *)(puVar3 + 0x15) = uVar8;
  *(undefined4 *)((long)puVar3 + 0xac) = uVar9;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var5._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_value._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX_01;
  }
  PVar11.super___shared_ptr<TgBot::Game,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi
  ;
  PVar11.super___shared_ptr<TgBot::Game,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar11.super___shared_ptr<TgBot::Game,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Game::Ptr TgTypeParser::parseJsonAndGetGame(const ptree& data) const {
    auto result(make_shared<Game>());
    result->title = data.get("title", "");
    result->description = data.get("description", "");
    result->photo = parseJsonAndGetArray<PhotoSize>(&TgTypeParser::parseJsonAndGetPhotoSize, data, "photo");
    result->text = data.get("text", "");
    result->textEntities = parseJsonAndGetArray<MessageEntity>(&TgTypeParser::parseJsonAndGetMessageEntity, data, "text_entities");
    result->animation = tryParseJson<Animation>(&TgTypeParser::parseJsonAndGetAnimation, data, "animation");
    return result;
}